

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_executor.hpp
# Opt level: O0

void duckdb::GenericExecutor::
     ExecuteTernaryInternal<duckdb::PrimitiveType<double>,duckdb::PrimitiveType<double>,duckdb::PrimitiveType<double>,duckdb::PrimitiveType<duckdb::string_t>,duckdb::BarFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
               (Vector *a,Vector *b,Vector *c,Vector *result,idx_t count,
               anon_class_16_2_52ce5e5c *fun)

{
  PrimitiveType<duckdb::string_t> value;
  PrimitiveType<double> x;
  VectorType VVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  Vector *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  anon_union_16_2_67f50693_for_value val;
  PrimitiveType<double> c_val;
  PrimitiveType<double> b_val;
  PrimitiveType<double> a_val;
  idx_t c_idx;
  idx_t b_idx;
  idx_t a_idx;
  idx_t i;
  STRUCT_STATE c_state;
  STRUCT_STATE b_state;
  STRUCT_STATE a_state;
  bool constant;
  Vector *in_stack_fffffffffffffe28;
  Vector *in_stack_fffffffffffffe30;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe52;
  undefined1 in_stack_fffffffffffffe53;
  undefined1 in_stack_fffffffffffffe54;
  TemplatedValidityMask<unsigned_long> *local_1a8;
  bool local_191;
  PrimitiveType<duckdb::string_t> local_168 [2];
  idx_t local_140;
  idx_t local_138;
  idx_t local_130;
  TemplatedValidityMask<unsigned_long> *local_128;
  SelectionVector *local_120;
  SelectionVector *local_c8;
  SelectionVector *local_80;
  bool local_31;
  TemplatedValidityMask<unsigned_long> *local_28;
  Vector *local_20;
  Vector *local_18;
  Vector *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  local_191 = false;
  if (VVar1 == CONSTANT_VECTOR) {
    VVar1 = Vector::GetVectorType(local_10);
    local_191 = false;
    if (VVar1 == CONSTANT_VECTOR) {
      VVar1 = Vector::GetVectorType(local_18);
      local_191 = VVar1 == CONSTANT_VECTOR;
    }
  }
  local_31 = local_191;
  PrimitiveTypeState::PrimitiveTypeState((PrimitiveTypeState *)0xea6e8b);
  PrimitiveTypeState::PrimitiveTypeState((PrimitiveTypeState *)0xea6e98);
  PrimitiveTypeState::PrimitiveTypeState((PrimitiveTypeState *)0xea6ea7);
  PrimitiveTypeState::PrepareVector
            ((PrimitiveTypeState *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0xea6ec6);
  PrimitiveTypeState::PrepareVector
            ((PrimitiveTypeState *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0xea6ee5);
  PrimitiveTypeState::PrepareVector
            ((PrimitiveTypeState *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0xea6f04);
  val.pointer.ptr = (char *)in_stack_fffffffffffffe40;
  val._0_8_ = in_stack_fffffffffffffe48;
  local_128 = (TemplatedValidityMask<unsigned_long> *)0x0;
  do {
    if ((local_31 & 1U) == 0) {
      local_1a8 = local_28;
    }
    else {
      local_1a8 = (TemplatedValidityMask<unsigned_long> *)0x1;
    }
    if (local_1a8 <= local_128) {
      if ((local_31 & 1U) != 0) {
        duckdb::Vector::SetVectorType((VectorType)local_20);
      }
      PrimitiveTypeState::~PrimitiveTypeState((PrimitiveTypeState *)0xea7235);
      PrimitiveTypeState::~PrimitiveTypeState((PrimitiveTypeState *)0xea7242);
      PrimitiveTypeState::~PrimitiveTypeState((PrimitiveTypeState *)0xea724f);
      return;
    }
    local_130 = SelectionVector::get_index(local_80,(idx_t)local_128);
    local_138 = SelectionVector::get_index(local_c8,(idx_t)local_128);
    local_140 = SelectionVector::get_index(local_120,(idx_t)local_128);
    uVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
    if (((bool)uVar2) &&
       (uVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30), (bool)uVar3)
       ) {
      uVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (!(bool)uVar4) goto LAB_00ea701b;
      in_stack_fffffffffffffe54 =
           PrimitiveType<double>::ConstructType
                     ((STRUCT_STATE *)
                      CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffe54,
                                                  CONCAT13(in_stack_fffffffffffffe53,
                                                           CONCAT12(in_stack_fffffffffffffe52,
                                                                    in_stack_fffffffffffffe50)))))),
                      val._0_8_,(PrimitiveType<double> *)val.pointer.ptr);
      if ((bool)in_stack_fffffffffffffe54) {
        in_stack_fffffffffffffe53 =
             PrimitiveType<double>::ConstructType
                       ((STRUCT_STATE *)
                        CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffe54,
                                                  CONCAT13(in_stack_fffffffffffffe53,
                                                           CONCAT12(in_stack_fffffffffffffe52,
                                                                    in_stack_fffffffffffffe50)))))),
                        val._0_8_,(PrimitiveType<double> *)val.pointer.ptr);
        if (!(bool)in_stack_fffffffffffffe53) goto LAB_00ea711b;
        in_stack_fffffffffffffe52 =
             PrimitiveType<double>::ConstructType
                       ((STRUCT_STATE *)
                        CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffe54,
                                                  CONCAT13(in_stack_fffffffffffffe53,
                                                           CONCAT12(in_stack_fffffffffffffe52,
                                                                    in_stack_fffffffffffffe50)))))),
                        val._0_8_,(PrimitiveType<double> *)val.pointer.ptr);
        if (!(bool)in_stack_fffffffffffffe52) goto LAB_00ea711b;
        x.val._2_1_ = (bool)in_stack_fffffffffffffe52;
        x.val._0_2_ = in_stack_fffffffffffffe50;
        x.val._3_1_ = in_stack_fffffffffffffe53;
        x.val._4_1_ = in_stack_fffffffffffffe54;
        x.val._5_1_ = uVar4;
        x.val._6_1_ = uVar3;
        x.val._7_1_ = uVar2;
        in_stack_fffffffffffffe30 = local_20;
        in_stack_fffffffffffffe38 = local_128;
        val.pointer = (anon_struct_16_3_d7536bce_for_pointer)
                      BarFunction::anon_class_16_2_52ce5e5c::operator()
                                ((anon_class_16_2_52ce5e5c *)local_128,x,
                                 (PrimitiveType<double>)val._0_8_,
                                 (PrimitiveType<double>)val.pointer.ptr);
        PrimitiveType<duckdb::string_t>::PrimitiveType(local_168,(string_t)val.pointer);
        value.val.value.pointer.ptr = val.pointer.ptr;
        value.val.value._0_8_ = in_stack_fffffffffffffe38;
        PrimitiveType<duckdb::string_t>::AssignResult
                  (in_stack_fffffffffffffe30,(idx_t)in_stack_fffffffffffffe28,value);
      }
      else {
LAB_00ea711b:
        duckdb::FlatVector::SetNull(local_20,(ulong)local_128,true);
      }
    }
    else {
LAB_00ea701b:
      duckdb::FlatVector::SetNull(local_20,(ulong)local_128,true);
    }
    local_128 = (TemplatedValidityMask<unsigned_long> *)((long)&local_128->validity_mask + 1);
  } while( true );
}

Assistant:

static void ExecuteTernaryInternal(Vector &a, Vector &b, Vector &c, Vector &result, idx_t count, FUNC &fun) {
		auto constant = a.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		                b.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		                c.GetVectorType() == VectorType::CONSTANT_VECTOR;

		typename A_TYPE::STRUCT_STATE a_state;
		typename B_TYPE::STRUCT_STATE b_state;
		typename C_TYPE::STRUCT_STATE c_state;

		a_state.PrepareVector(a, count);
		b_state.PrepareVector(b, count);
		c_state.PrepareVector(c, count);

		for (idx_t i = 0; i < (constant ? 1 : count); i++) {
			auto a_idx = a_state.main_data.sel->get_index(i);
			auto b_idx = b_state.main_data.sel->get_index(i);
			auto c_idx = c_state.main_data.sel->get_index(i);
			if (!a_state.main_data.validity.RowIsValid(a_idx) || !b_state.main_data.validity.RowIsValid(b_idx) ||
			    !c_state.main_data.validity.RowIsValid(c_idx)) {
				FlatVector::SetNull(result, i, true);
				continue;
			}
			A_TYPE a_val;
			B_TYPE b_val;
			C_TYPE c_val;
			if (!A_TYPE::ConstructType(a_state, i, a_val) || !B_TYPE::ConstructType(b_state, i, b_val) ||
			    !C_TYPE::ConstructType(c_state, i, c_val)) {
				FlatVector::SetNull(result, i, true);
				continue;
			}
			RESULT_TYPE::AssignResult(result, i, fun(a_val, b_val, c_val));
		}
		if (constant) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	}